

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O2

void vera::flipPixelsVertically<unsigned_short>
               (unsigned_short *_pixels,int _width,int _height,int _bytes_per_pixel)

{
  size_t __size;
  void *__ptr;
  long lVar1;
  unsigned_short *__src;
  
  lVar1 = (long)(_width * _bytes_per_pixel);
  __size = lVar1 * 2;
  __ptr = malloc(__size);
  __src = _pixels + (_height + -1) * lVar1;
  for (; _pixels < __src; _pixels = _pixels + lVar1) {
    memcpy(__ptr,_pixels,__size);
    memcpy(_pixels,__src,__size);
    memcpy(__src,__ptr,__size);
    __src = __src + -lVar1;
  }
  free(__ptr);
  return;
}

Assistant:

void flipPixelsVertically(T *_pixels, int _width, int _height, int _bytes_per_pixel) {
    const size_t stride = _width * _bytes_per_pixel;
    T *row = (T*)malloc(stride * sizeof(T));
    T *low = _pixels;
    T *high = &_pixels[(_height - 1) * stride];
    for (; low < high; low += stride, high -= stride) {
        std::memcpy(row, low, stride * sizeof(T));
        std::memcpy(low, high, stride * sizeof(T));
        std::memcpy(high, row, stride * sizeof(T));
    }
    free(row);
}